

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void bloaty::anon_unknown_0::ReadELFSymbols
               (InputFile *file,RangeSink *sink,SymbolTable *table,bool disassemble)

{
  string_view data;
  size_t in_RDX;
  char *in_RSI;
  InputFile *in_RDI;
  bool capstone_available;
  DisassemblyInfo *infop;
  DisassemblyInfo info;
  bool is_object;
  RangeSink *in_stack_000002f8;
  InputFile *in_stack_00000300;
  anon_class_40_6_17eaf085 in_stack_00000310;
  DisassemblyInfo *in_stack_fffffffffffffed0;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff09;
  InputFile *in_stack_ffffffffffffff10;
  
  InputFile::data(in_RDI);
  data._M_str = in_RSI;
  data._M_len = in_RDX;
  IsObjectFile(data);
  DisassemblyInfo::DisassemblyInfo(in_stack_fffffffffffffed0);
  ReadElfArchMode(in_stack_ffffffffffffff10,
                  (cs_arch *)CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08),
                  (cs_mode *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  (anonymous_namespace)::
  ForEachElf<bloaty::(anonymous_namespace)::ReadELFSymbols(bloaty::InputFile_const&,bloaty::RangeSink*,std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>*,bool)::__0>
            (in_stack_00000300,in_stack_000002f8,in_stack_00000310);
  DisassemblyInfo::~DisassemblyInfo((DisassemblyInfo *)0x1d298b);
  return;
}

Assistant:

static void ReadELFSymbols(const InputFile& file, RangeSink* sink,
                           SymbolTable* table, bool disassemble) {
  bool is_object = IsObjectFile(file.data());
  DisassemblyInfo info;
  DisassemblyInfo* infop = &info;
  bool capstone_available = ReadElfArchMode(file, &info.arch, &info.mode);

  ForEachElf(
      file, sink,
      [=](const ElfFile& elf, string_view /*filename*/, uint64_t index_base) {
        for (Elf64_Xword i = 1; i < elf.section_count(); i++) {
          ElfFile::Section section;
          elf.ReadSection(i, &section);

          if (section.header().sh_type != SHT_SYMTAB) {
            continue;
          }

          Elf64_Word symbol_count = section.GetEntryCount();

          // Find the corresponding section where the strings for the symbol
          // table can be found.
          ElfFile::Section strtab_section;
          elf.ReadSection(section.header().sh_link, &strtab_section);
          if (strtab_section.header().sh_type != SHT_STRTAB) {
            THROW("symtab section pointed to non-strtab section");
          }

          for (Elf64_Word i = 1; i < symbol_count; i++) {
            Elf64_Sym sym;

            section.ReadSymbol(i, &sym, nullptr);

            if (ELF64_ST_TYPE(sym.st_info) == STT_SECTION) {
              continue;
            }

            if (sym.st_shndx == STN_UNDEF) {
              continue;
            }

            if (sym.st_size == 0) {
              // Maybe try to refine?  See ReadELFSectionsRefineSymbols below.
              continue;
            }

            string_view name = strtab_section.ReadString(sym.st_name);
            uint64_t full_addr =
                ToVMAddr(sym.st_value, index_base + sym.st_shndx, is_object);
            if (sink && !(capstone_available && disassemble)) {
              sink->AddVMRangeAllowAlias(
                  "elf_symbols", full_addr, sym.st_size,
                  ItaniumDemangle(name, sink->data_source()));
            }
            if (table) {
              table->insert(
                  std::make_pair(name, std::make_pair(full_addr, sym.st_size)));
            }
            if (capstone_available && disassemble &&
                ELF64_ST_TYPE(sym.st_info) == STT_FUNC) {
              if (verbose_level > 1) {
                printf("Disassembling function: %s\n", name.data());
              }
              // TODO(brandonvu) Continue if VM pointer cannot be translated. Issue #315
              uint64_t unused;
              if (!sink->Translator()->vm_map.Translate(full_addr, &unused)) {
                WARN("Can't translate VM pointer ($0) to file", full_addr);
                continue;
              }
              infop->text = sink->TranslateVMToFile(full_addr).substr(0, sym.st_size);
              infop->start_address = full_addr;
              DisassembleFindReferences(*infop, sink);
            }
          }
        }
      });
}